

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

char * Scl_LibertyFindMatch(char *pPos,char *pEnd)

{
  int iVar1;
  
  if (*pPos == '(') {
    iVar1 = 0;
    while ((pPos < pEnd &&
           (iVar1 = (iVar1 + (uint)(*pPos == '(')) - (uint)(*pPos == ')'), iVar1 != 0))) {
      pPos = pPos + 1;
    }
  }
  else {
    if (*pPos != '{') {
      __assert_fail("*pPos == \'(\' || *pPos == \'{\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                    ,0x10a,"char *Scl_LibertyFindMatch(char *, char *)");
    }
    iVar1 = 0;
    while ((pPos < pEnd &&
           (iVar1 = (iVar1 + (uint)(*pPos == '{')) - (uint)(*pPos == '}'), iVar1 != 0))) {
      pPos = pPos + 1;
    }
  }
  if ((*pPos != ')') && (*pPos != '}')) {
    __assert_fail("*pPos == \')\' || *pPos == \'}\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                  ,0x123,"char *Scl_LibertyFindMatch(char *, char *)");
  }
  return pPos;
}

Assistant:

static inline char * Scl_LibertyFindMatch( char * pPos, char * pEnd )
{
    int Counter = 0;
    assert( *pPos == '(' || *pPos == '{' );
    if ( *pPos == '(' )
    {
        for ( ; pPos < pEnd; pPos++ )
        {
            if ( *pPos == '(' )
                Counter++;
            if ( *pPos == ')' )
                Counter--;
            if ( Counter == 0 )
                break;
        }
    }
    else
    {
        for ( ; pPos < pEnd; pPos++ )
        {
            if ( *pPos == '{' )
                Counter++;
            if ( *pPos == '}' )
                Counter--;
            if ( Counter == 0 )
                break;
        }
    }
    assert( *pPos == ')' || *pPos == '}' );
    return pPos;
}